

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O0

REF_STATUS
ref_phys_bcast_parts
          (REF_MPI ref_mpi,REF_INT *part_complete,REF_INT *part_ncell,REF_INT max_ncell,
          REF_INT node_per,REF_DBL *param_6,REF_INT *ncell,REF_DBL **xyz)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  REF_DBL *pRVar4;
  long lVar5;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT i;
  REF_INT part;
  REF_INT offset;
  REF_INT last_part;
  REF_INT first_part;
  REF_INT total;
  REF_DBL *local_xyz_local;
  REF_INT node_per_local;
  REF_INT max_ncell_local;
  REF_INT *part_ncell_local;
  REF_INT *part_complete_local;
  REF_MPI ref_mpi_local;
  
  if (*part_complete < ref_mpi->n) {
    iVar2 = *part_complete;
    part = *part_complete;
    *ncell = part_ncell[iVar2];
    ref_private_macro_code_rss = iVar2;
    while ((ref_private_macro_code_rss = ref_private_macro_code_rss + 1,
           ref_private_macro_code_rss < ref_mpi->n &&
           (*ncell + part_ncell[ref_private_macro_code_rss] <= max_ncell))) {
      part = ref_private_macro_code_rss;
      *ncell = part_ncell[ref_private_macro_code_rss] + *ncell;
    }
    *part_complete = part + 1;
    iVar1 = node_per * 3 * *ncell;
    if (iVar1 < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x64e,
             "ref_phys_bcast_parts","malloc *xyz of REF_DBL negative");
      ref_mpi_local._4_4_ = 1;
    }
    else {
      pRVar4 = (REF_DBL *)malloc((long)iVar1 << 3);
      *xyz = pRVar4;
      if (*xyz == (REF_DBL *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
               0x64e,"ref_phys_bcast_parts","malloc *xyz of REF_DBL NULL");
        ref_mpi_local._4_4_ = 2;
      }
      else {
        i = 0;
        for (ref_private_macro_code_rss = iVar2; ref_private_macro_code_rss <= part;
            ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
          iVar2 = node_per * 3 * part_ncell[ref_private_macro_code_rss];
          if (ref_private_macro_code_rss == ref_mpi->id) {
            if (0 < part_ncell[ref_private_macro_code_rss]) {
              uVar3 = ref_mpi_bcast_from_rank(ref_mpi,param_6,iVar2,3,ref_private_macro_code_rss);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                       ,0x657,"ref_phys_bcast_parts",(ulong)uVar3,"bcast ncell");
                return uVar3;
              }
              for (ref_private_macro_code_rss_1 = 0; ref_private_macro_code_rss_1 < iVar2;
                  ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
                (*xyz)[ref_private_macro_code_rss_1 + i] = param_6[ref_private_macro_code_rss_1];
              }
            }
          }
          else if ((0 < part_ncell[ref_private_macro_code_rss]) &&
                  (uVar3 = ref_mpi_bcast_from_rank
                                     (ref_mpi,*xyz + i,iVar2,3,ref_private_macro_code_rss),
                  uVar3 != 0)) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
                   0x65e,"ref_phys_bcast_parts",(ulong)uVar3,"bcast ncell");
            return uVar3;
          }
          i = iVar2 + i;
        }
        lVar5 = (long)(node_per * 3 * *ncell);
        if (lVar5 == i) {
          ref_mpi_local._4_4_ = 0;
        }
        else {
          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
                 0x664,"ref_phys_bcast_parts","miscount",lVar5,(long)i);
          ref_mpi_local._4_4_ = 1;
        }
      }
    }
  }
  else {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x641,
           "ref_phys_bcast_parts","already complete");
    ref_mpi_local._4_4_ = 1;
  }
  return ref_mpi_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_phys_bcast_parts(
    REF_MPI ref_mpi, REF_INT *part_complete, REF_INT *part_ncell,
    REF_INT max_ncell, REF_INT node_per, REF_DBL *local_xyz, REF_INT *ncell,
    REF_DBL **xyz) {
  REF_INT total;
  REF_INT first_part, last_part;
  REF_INT offset, part, i;
  RAS(*part_complete < ref_mpi_n(ref_mpi), "already complete");
  first_part = *part_complete;
  last_part = *part_complete;
  (*ncell) = part_ncell[first_part];

  for (part = first_part + 1; part < ref_mpi_n(ref_mpi); part++) {
    if ((*ncell) + part_ncell[part] > max_ncell) break;
    last_part = part;
    (*ncell) += part_ncell[part];
  }
  (*part_complete) = last_part + 1;

  total = 3 * node_per * (*ncell);
  ref_malloc(*xyz, total, REF_DBL);

  offset = 0;
  for (part = first_part; part <= last_part; part++) {
    total = 3 * node_per * part_ncell[part];
    if (part == ref_mpi_rank(ref_mpi)) {
      if (part_ncell[part] > 0) {
        RSS(ref_mpi_bcast_from_rank(ref_mpi, local_xyz, total, REF_DBL_TYPE,
                                    part),
            "bcast ncell");
        for (i = 0; i < total; i++) (*xyz)[i + offset] = local_xyz[i];
      }
    } else {
      if (part_ncell[part] > 0) {
        RSS(ref_mpi_bcast_from_rank(ref_mpi, &((*xyz)[offset]), total,
                                    REF_DBL_TYPE, part),
            "bcast ncell");
      }
    }
    offset += total;
  }
  total = 3 * node_per * (*ncell);
  REIS(total, offset, "miscount");

  return REF_SUCCESS;
}